

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# section.cpp
# Opt level: O0

void sect_SetLoadSection(char *name,SectionType type,uint32_t org,SectionSpec *attribs,
                        SectionModifier mod)

{
  bool bVar1;
  Section *pSVar2;
  uint32_t local_38;
  Section *sect;
  SectionModifier mod_local;
  SectionSpec *attribs_local;
  uint32_t org_local;
  SectionType type_local;
  char *name_local;
  
  bVar1 = checkcodesection();
  if (bVar1) {
    if (currentLoadSection == (Section *)0x0) {
      bVar1 = sect_HasData(type);
      if (bVar1) {
        error("`LOAD` blocks cannot create a ROM section\n");
      }
      else if (mod == SECTION_FRAGMENT) {
        error("`LOAD FRAGMENT` is not allowed\n");
      }
      else {
        pSVar2 = getSection(name,type,org,attribs,mod);
        currentLoadScope = sym_GetCurrentSymbolScope();
        changeSection();
        if (mod == SECTION_UNION) {
          local_38 = 0;
        }
        else {
          local_38 = pSVar2->size;
        }
        loadOffset = curOffset - local_38;
        curOffset = curOffset - loadOffset;
        currentLoadSection = pSVar2;
      }
    }
    else {
      error("`LOAD` blocks cannot be nested\n");
    }
  }
  return;
}

Assistant:

void sect_SetLoadSection(char const *name, enum SectionType type, uint32_t org,
			 struct SectionSpec const *attribs, enum SectionModifier mod)
{
	// Important info: currently, UNION and LOAD cannot interact, since UNION is prohibited in
	// "code" sections, whereas LOAD is restricted to them.
	// Therefore, any interactions are NOT TESTED, so lift either of those restrictions at
	// your own peril! ^^

	if (!checkcodesection())
		return;

	if (currentLoadSection) {
		error("`LOAD` blocks cannot be nested\n");
		return;
	}

	if (sect_HasData(type)) {
		error("`LOAD` blocks cannot create a ROM section\n");
		return;
	}

	if (mod == SECTION_FRAGMENT) {
		error("`LOAD FRAGMENT` is not allowed\n");
		return;
	}

	struct Section *sect = getSection(name, type, org, attribs, mod);

	currentLoadScope = sym_GetCurrentSymbolScope();
	changeSection();
	loadOffset = curOffset - (mod == SECTION_UNION ? 0 : sect->size);
	curOffset -= loadOffset;
	currentLoadSection = sect;
}